

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O0

void __thiscall
cfd::core::CfdException::CfdException(CfdException *this,CfdError error_code,string *message)

{
  string *message_local;
  CfdError error_code_local;
  CfdException *this_local;
  
  ::std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__CfdException_009e0398;
  this->error_code_ = error_code;
  ::std::__cxx11::string::string((string *)&this->message_,(string *)message);
  return;
}

Assistant:

CfdException(CfdError error_code, const std::string& message)
      : error_code_(error_code), message_(message) {}